

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::copyInto
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this,uint8 *buffer)

{
  ushort uVar1;
  uint32 uVar2;
  byte bVar3;
  ulong uVar4;
  
  uVar1 = (this->clientID).length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)buffer = uVar1;
  memcpy(buffer + 2,(this->clientID).data,(ulong)(this->clientID).length);
  uVar4 = (ulong)(this->clientID).length + 2;
  if (this->fixedHeader != (FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *)0x0) {
    bVar3 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
    if ((bVar3 & 4) != 0) {
      uVar2 = WillMessage::copyInto(this->willMessage,buffer + uVar4);
      bVar3 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
      uVar4 = (ulong)(uVar2 + (int)uVar4);
    }
    if ((char)bVar3 < '\0') {
      uVar1 = (this->username).length;
      if (BigEndian(unsigned_short)::signature != '\x01') {
        if (BigEndian(unsigned_short)::signature == '\x04') {
          uVar1 = uVar1 << 8 | uVar1 >> 8;
        }
        else {
          uVar1 = 0;
        }
      }
      *(ushort *)(buffer + uVar4) = uVar1;
      memcpy((ushort *)((long)(buffer + uVar4) + 2),(this->username).data,
             (ulong)(this->username).length);
      uVar4 = (ulong)((int)uVar4 + (uint)(this->username).length + 2);
      bVar3 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
    }
    if ((bVar3 & 0x40) != 0) {
      uVar1 = (this->password).length;
      if (BigEndian(unsigned_short)::signature != '\x01') {
        if (BigEndian(unsigned_short)::signature == '\x04') {
          uVar1 = uVar1 << 8 | uVar1 >> 8;
        }
        else {
          uVar1 = 0;
        }
      }
      *(ushort *)(buffer + uVar4) = uVar1;
      memcpy((ushort *)((long)(buffer + uVar4) + 2),(this->password).data,
             (ulong)(this->password).length);
      uVar4 = (ulong)((int)uVar4 + (uint)(this->password).length + 2);
    }
  }
  return (uint32)uVar4;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = clientID.copyInto(buffer);
                    if (!fixedHeader) return o;
                    if (fixedHeader->willFlag)       o += willMessage->copyInto(buffer+o);
                    if (fixedHeader->usernameFlag)   o += username.copyInto(buffer+o);
                    if (fixedHeader->passwordFlag)   o += password.copyInto(buffer+o);
                    return o;
                }